

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mei.c
# Opt level: O1

int mei_fwstatus(mei *me,uint32_t fwsts_num,uint32_t *fwsts)

{
  mei_log_callback p_Var1;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  ssize_t sVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  long in_FS_OFFSET;
  char path [33];
  char local_71 [9];
  char local_68 [32];
  undefined1 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar8 = 0xffffffea;
  if (fwsts != (uint32_t *)0x0 && me != (mei *)0x0) {
    if (fwsts_num < 6) {
      if (me->device == (char *)0x0) {
        pcVar3 = "/dev/mei0";
      }
      else {
        pcVar3 = strstr(me->device,"/dev/");
        if (pcVar3 == (char *)0x0) {
          if (me->log_level != MEI_LOG_LEVEL_QUIET) {
            if (me->log_callback == (mei_log_callback)0x0) {
              __syslog_chk(3,1,"me: error: Device does not start with \'%s\'\n","/dev/");
            }
            else {
              (*me->log_callback)(true,"me: error: Device does not start with \'%s\'\n","/dev/");
            }
          }
          goto LAB_001224db;
        }
      }
      iVar2 = __snprintf_chk(local_68,0x21,1,0x21,"/sys/class/mei/%s/fw_status",pcVar3 + 5);
      if (iVar2 < 0) {
        uVar7 = 0xffffffea;
      }
      else {
        local_48 = 0;
        piVar4 = __errno_location();
        *piVar4 = 0;
        iVar2 = open(local_68,0x80000,0);
        if (iVar2 == -1) {
          iVar2 = *piVar4;
          me->last_err = iVar2;
          uVar7 = -iVar2;
        }
        else {
          *piVar4 = 0;
          sVar5 = pread(iVar2,local_71,9,(ulong)(fwsts_num * 9));
          if (sVar5 == -1) {
            me->last_err = *piVar4;
            close(iVar2);
            uVar7 = -me->last_err;
          }
          else {
            close(iVar2);
            if (sVar5 < 9) {
              me->last_err = 0x47;
              uVar7 = 0xffffffb9;
            }
            else {
              *piVar4 = 0;
              uVar7 = 0;
              uVar6 = strtoul(local_71,(char **)0x0,0x10);
              iVar2 = *piVar4;
              if (iVar2 == 0) {
                *fwsts = (uint32_t)uVar6;
              }
              else {
                me->last_err = iVar2;
                uVar7 = -iVar2;
              }
            }
          }
        }
      }
      uVar8 = 0;
      if (((int)uVar7 < 0) && (uVar8 = uVar7, me->log_level != MEI_LOG_LEVEL_QUIET)) {
        p_Var1 = me->log_callback;
        pcVar3 = strerror(-uVar7);
        if (p_Var1 == (mei_log_callback)0x0) {
          __syslog_chk(3,1,"me: error: Cannot get FW status [%d]:%s\n",uVar7,pcVar3);
        }
        else {
          (*p_Var1)(true,"me: error: Cannot get FW status [%d]:%s\n",(ulong)uVar7,pcVar3);
        }
      }
    }
    else if (me->log_level != MEI_LOG_LEVEL_QUIET) {
      if (me->log_callback == (mei_log_callback)0x0) {
        __syslog_chk(3,1,"me: error: FW status number should be 0..5\n");
      }
      else {
        (*me->log_callback)(true,"me: error: FW status number should be 0..5\n");
      }
    }
  }
LAB_001224db:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar8;
  }
  __stack_chk_fail();
}

Assistant:

int mei_fwstatus(struct mei *me, uint32_t fwsts_num, uint32_t *fwsts)
{
	char *device;
	int rc;

	if (!me || !fwsts)
		return -EINVAL;

	if (fwsts_num > MAX_FW_STATUS_NUM) {
		mei_err(me, "FW status number should be 0..5\n");
		return -EINVAL;
	}

	if (me->device) {
		device = strstr(me->device, MEI_DEFAULT_DEVICE_PREFIX);
		if (!device) {
			mei_err(me, "Device does not start with '%s'\n",
				MEI_DEFAULT_DEVICE_PREFIX);
			return -EINVAL;
		}
		device += strlen(MEI_DEFAULT_DEVICE_PREFIX);
	} else {
		device = MEI_DEFAULT_DEVICE_NAME;
	}
	rc = __mei_fwsts(me, device, fwsts_num, fwsts);
	if (rc < 0) {
		mei_err(me, "Cannot get FW status [%d]:%s\n",
			rc, strerror(-rc));
		return rc;
	}

	return 0;
}